

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O0

void __thiscall QMT::DES::makekey(DES *this,uint *keyleft,uint *keyright,uint number)

{
  uint (*pauVar1) [2];
  uint uVar2;
  int local_44;
  int j;
  uint *Poutkey;
  uint *Ptmpkey;
  uint local_28;
  uint tmpkey [2];
  uint number_local;
  uint *keyright_local;
  uint *keyleft_local;
  DES *this_local;
  
  tmpkey[0] = number;
  unique0x10000299 = keyright;
  memset((void *)((long)&Ptmpkey + 4),0,8);
  pauVar1 = this->g_outkey + tmpkey[0];
  InitIntArray(this,(uint *)((long)&Ptmpkey + 4),2);
  uVar2 = *keyleft & this->wz_leftandtab[this->wz_lefttable[tmpkey[0]]];
  local_28 = *stack0xffffffffffffffe0 & this->wz_leftandtab[this->wz_lefttable[tmpkey[0]]];
  if (this->wz_lefttable[tmpkey[0]] == '\x01') {
    Ptmpkey._4_4_ = uVar2 >> 0x1b;
    local_28 = local_28 >> 0x1b;
  }
  else {
    Ptmpkey._4_4_ = uVar2 >> 0x1a;
    local_28 = local_28 >> 0x1a;
  }
  *keyleft = *keyleft << (this->wz_lefttable[tmpkey[0]] & 0x1fU);
  *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 << (this->wz_lefttable[tmpkey[0]] & 0x1fU);
  *keyleft = Ptmpkey._4_4_ & 0xfffffff0 | *keyleft;
  *stack0xffffffffffffffe0 = local_28 & 0xfffffff0 | *stack0xffffffffffffffe0;
  for (local_44 = 0; local_44 < 0x30; local_44 = local_44 + 1) {
    if (local_44 < 0x18) {
      if ((this->wz_pc2[this->wz_keychoose[local_44] + -1] & *keyleft) != 0) {
        (*pauVar1)[0] = this->wz_pc2[local_44] | (*pauVar1)[0];
      }
    }
    else if ((this->wz_pc2[this->wz_keychoose[local_44] + -0x1c] & *stack0xffffffffffffffe0) != 0) {
      (*pauVar1)[1] = this->wz_pc2[local_44 + -0x18] | (*pauVar1)[1];
    }
  }
  return;
}

Assistant:

void DES::makekey(unsigned int *keyleft,unsigned int *keyright ,unsigned int number)
  {
  	unsigned int tmpkey[2] ={0};
  	unsigned int *Ptmpkey = (unsigned int*)tmpkey;
  	unsigned int *Poutkey = (unsigned int*)&g_outkey[number];
  	int j;

  	InitIntArray(tmpkey, 2);

  	*Ptmpkey = *keyleft&wz_leftandtab[wz_lefttable[number]];
  	Ptmpkey[1] = *keyright&wz_leftandtab[wz_lefttable[number]];
  	if (wz_lefttable[number] == 1)
  	{
  		*Ptmpkey >>= 27;
  		Ptmpkey[1] >>= 27;
  	}
  	else
  	{
  		*Ptmpkey >>= 26;
  		Ptmpkey[1] >>= 26;
  	}
  	Ptmpkey[0] &= 0xfffffff0;
  	Ptmpkey[1] &= 0xfffffff0;

  	*keyleft <<= wz_lefttable[number];
  	*keyright <<= wz_lefttable[number];
  	*keyleft |= Ptmpkey[0];
  	*keyright |= Ptmpkey[1];
  	Ptmpkey[0] = 0;
  	//Ptmpkey[1] = 0;

  	for (j = 0; j < 48; j++)
  	{
  		if ( j >= 24 )
  	     {
  	       if ( wz_pc2[wz_keychoose[j] - 28] & *keyright ){
  					Poutkey[1] |= wz_pc2[j - 24];
  				 }

  	     }
  	     else if ( wz_pc2[wz_keychoose[j] - 1] & *keyleft )
  	     {
  	       *Poutkey |= wz_pc2[j];
  	     }
  	}

  }